

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O2

List<Variant> * __thiscall Variant::toList(Variant *this)

{
  Data *pDVar1;
  List<Variant> *other;
  List<Variant> *this_00;
  
  pDVar1 = this->data;
  if ((pDVar1->type == listType) && (pDVar1->ref < 2)) {
    this_00 = (List<Variant> *)(pDVar1 + 1);
  }
  else {
    pDVar1 = (Data *)operator_new__(0x70);
    this_00 = (List<Variant> *)(pDVar1 + 1);
    other = toList(this);
    List<Variant>::List(this_00,other);
    clear(this);
    this->data = pDVar1;
    pDVar1->type = listType;
    pDVar1->ref = 1;
  }
  return this_00;
}

Assistant:

List<Variant>& toList()
  {
    if(data->type != listType || data->ref > 1)
    {
      Data* newData = (Data*)new char[sizeof(Data) + sizeof(List<Variant>)];
      List<Variant>* list = (List<Variant>*)(newData + 1);
      new (list) List<Variant>(((const Variant*)this)->toList());
      clear();
      data = newData;
      data->type = listType;
      data->ref = 1;
      return *list;
    }
    return *(List<Variant>*)(data + 1);
  }